

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void ywalg(double *x,int N,int p,double *phi)

{
  size_t sVar1;
  int iVar2;
  double *acorr;
  double *B;
  void *__ptr;
  double *A;
  double *C;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  sVar1 = (long)p * 8 + 8;
  acorr = (double *)malloc(sVar1);
  B = (double *)malloc(sVar1);
  sVar1 = (long)p * 8;
  __ptr = malloc(sVar1);
  A = (double *)malloc(sVar1);
  C = (double *)malloc(8);
  autocorr(x,N,acorr,p + 1);
  dVar11 = *acorr;
  dVar10 = -acorr[1];
  *B = dVar10;
  iVar2 = 1;
  if (1 < p) {
    iVar2 = p;
  }
  lVar9 = 1;
  lVar7 = 0;
  uVar8 = 0;
  while (uVar8 != iVar2 - 1) {
    pdVar3 = A;
    for (uVar5 = uVar8; -1 < (long)uVar5; uVar5 = uVar5 - 1) {
      *pdVar3 = acorr[uVar5 + 1];
      pdVar3 = pdVar3 + 1;
    }
    dVar11 = dVar11 * (1.0 - dVar10 * dVar10);
    uVar5 = uVar8 + 1;
    mmult(A,B,C,1,(int)uVar5,1);
    dVar10 = -(*C + acorr[uVar8 + 2]) / dVar11;
    lVar4 = lVar7;
    for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
      *(double *)((long)__ptr + lVar6 * 8) = *(double *)((long)B + lVar4) * dVar10 + B[lVar6];
      lVar4 = lVar4 + -8;
    }
    for (lVar4 = 0; lVar9 != lVar4; lVar4 = lVar4 + 1) {
      B[lVar4] = *(double *)((long)__ptr + lVar4 * 8);
    }
    B[uVar5] = dVar10;
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + 8;
    uVar8 = uVar5;
  }
  uVar5 = 0;
  uVar8 = (ulong)(uint)p;
  if (p < 1) {
    uVar8 = uVar5;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    phi[uVar5] = -B[uVar5];
  }
  free(acorr);
  free(__ptr);
  free(B);
  free(A);
  free(C);
  return;
}

Assistant:

void ywalg(double *x, int N, int p, double *phi) {
	int lag,k,j;
	double *acf,*z,*y,*temp1,*temp2;
	double a, b;

	lag = p + 1;
	acf = (double*)malloc(sizeof(double)* lag);
	y = (double*)malloc(sizeof(double)* lag);
	z = (double*)malloc(sizeof(double)* p);
	temp1 = (double*)malloc(sizeof(double)* p);
	temp2 = (double*)malloc(sizeof(double)* 1);

	autocorr(x, N, acf, lag);
	b = acf[0];
	a = y[0] = -acf[1];

	for (k = 0; k < p - 1; ++k) {
		b = (1 - a*a) * b;
		for (j = k; j >= 0; --j) {
			temp1[k-j] = acf[j+1];
		}
		mmult(temp1, y, temp2, 1, k + 1, 1);

		a = -(*temp2 + acf[k + 2]) / b;

		for (j = 0; j <= k; ++j) {
			z[j] = y[j] + a * y[k - j];
		}

		for (j = 0; j <= k; ++j) {
			y[j] = z[j];
		}
		y[k + 1] = a;

	}

	for (j = 0; j < p; ++j) {
		phi[j] = -1.0 * y[j];
	}


	free(acf); 
	free(z);
	free(y);
	free(temp1);
	free(temp2);
}